

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nth-derivative.h
# Opt level: O2

int32 __thiscall NthDerivativeCoder::Encode(NthDerivativeCoder *this,int32 k)

{
  uint uVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar1 = this->m_;
  uVar3 = 0;
  uVar4 = 0;
  if (0 < (int)uVar1) {
    uVar4 = (ulong)uVar1;
  }
  for (; uVar4 != uVar3; uVar3 = uVar3 + 1) {
    iVar2 = this->memory_[uVar3];
    this->memory_[uVar3] = k;
    k = k - iVar2;
  }
  if ((int)uVar1 < this->n_) {
    this->m_ = uVar1 + 1;
    this->memory_[(int)uVar1] = k;
  }
  return k;
}

Assistant:

inline int32 NthDerivativeCoder::Encode(int32 k) {
  for (int i = 0; i < m_; ++i) {
    uint32 delta = static_cast<uint32>(k) - memory_[i];
    memory_[i] = k;
    k = delta;
  }
  if (m_ < n_)
    memory_[m_++] = k;
  return k;
}